

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ordermatch.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  bool bVar1;
  undefined **ppuVar2;
  undefined **ppuVar3;
  undefined **ppuVar4;
  int iVar5;
  const_iterator cVar6;
  size_t sVar7;
  string value;
  string file;
  Application application;
  SessionSettings settings;
  FileStoreFactory storeFactory;
  ScreenLogFactory logFactory;
  SocketAcceptor acceptor;
  undefined1 *local_5b0;
  long local_5a8;
  undefined1 local_5a0;
  undefined7 uStack_59f;
  key_type local_590;
  undefined **local_570;
  undefined **local_568;
  undefined **local_560;
  undefined **local_558;
  undefined **local_550;
  undefined **local_548;
  undefined **local_540;
  undefined **local_538;
  undefined **local_530;
  long *local_528 [2];
  long local_518 [2];
  undefined **local_508;
  undefined **local_500;
  undefined **local_4f8;
  undefined **local_4f0;
  undefined **local_4e8;
  undefined **local_4e0;
  undefined **local_4d8;
  undefined **local_4d0;
  undefined **local_4c8;
  undefined **local_4c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>_>_>
  local_4b8;
  undefined8 uStack_488;
  undefined8 local_480;
  SessionSettings local_478;
  undefined1 local_3e8 [104];
  _Alloc_hider local_380;
  char local_370 [16];
  bool local_360;
  code *local_358;
  long *local_350;
  long local_340 [2];
  _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
  local_330;
  Dictionary local_300;
  undefined *local_2a0 [2];
  _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
  local_290;
  Dictionary local_260;
  allocator<char> local_200 [464];
  
  if (argc == 2) {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_528,argv[1],local_200);
    FIX::SessionSettings::SessionSettings(&local_478,(string *)local_528,false);
    local_4b8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_4b8._M_impl.super__Rb_tree_header._M_header;
    local_508 = &PTR__Application_00147930;
    local_500 = &PTR__Application_001479a8;
    local_4f8 = &PTR__Application_00147b88;
    local_4f0 = &PTR__Application_00147d78;
    local_4e8 = &PTR__Application_00148088;
    local_4e0 = &PTR__Application_001484f8;
    local_4d8 = &PTR__Application_00148af8;
    local_530 = &PTR__Application_001490f8;
    local_4d0 = &PTR__Application_001490f8;
    local_538 = &PTR__Application_001497b8;
    local_4c8 = &PTR__Application_001497b8;
    local_540 = &PTR__Application_0014a1a8;
    local_4c0 = &PTR__Application_0014a1a8;
    local_4b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_4b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_4b8._M_impl.super__Rb_tree_header._M_node_count = 0;
    uStack_488 = 0;
    local_480 = 0;
    local_4b8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_4b8._M_impl.super__Rb_tree_header._M_header._M_left;
    FIX::FileStoreFactory::FileStoreFactory((FileStoreFactory *)&local_358,&local_478);
    local_548 = &PTR__Application_00148af8;
    std::
    _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
    ::_Rb_tree((_Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
                *)local_3e8,
               (_Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
                *)&local_478);
    local_3e8._48_8_ = &PTR__Dictionary_0014ad38;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(local_3e8 + 0x38),&local_478.m_defaults.m_data._M_t);
    local_380._M_p = local_370;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_380,local_478.m_defaults.m_name._M_dataplus._M_p,
               local_478.m_defaults.m_name._M_dataplus._M_p +
               local_478.m_defaults.m_name._M_string_length);
    local_360 = local_478.m_resolveEnvVars;
    FIX::ScreenLogFactory::ScreenLogFactory
              ((ScreenLogFactory *)local_2a0,(SessionSettings *)local_3e8);
    FIX::Dictionary::~Dictionary((Dictionary *)(local_3e8 + 0x30));
    std::
    _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
    ::~_Rb_tree((_Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
                 *)local_3e8);
    FIX::SocketAcceptor::SocketAcceptor
              ((SocketAcceptor *)local_200,(Application *)&local_508,
               (MessageStoreFactory *)&local_358,&local_478,(LogFactory *)local_2a0);
    local_570 = &PTR__Application_001484f8;
    local_568 = &PTR__Application_00148088;
    local_560 = &PTR__Application_00147d78;
    local_558 = &PTR__Application_00147b88;
    local_550 = &PTR__Application_00147930;
    FIX::Acceptor::start();
    do {
      local_5a8 = 0;
      local_5a0 = 0;
      local_5b0 = &local_5a0;
      std::operator>>((istream *)&std::cin,(string *)&local_5b0);
      iVar5 = std::__cxx11::string::compare((char *)&local_5b0);
      if (iVar5 == 0) {
        OrderMatcher::display((OrderMatcher *)&local_4b8);
LAB_0013199b:
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
        std::ostream::put(-0x50);
        bVar1 = true;
        std::ostream::flush();
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)&local_5b0);
        if (iVar5 != 0) {
          local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_590,local_5b0,local_5b0 + local_5a8);
          cVar6 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>_>_>
                  ::find(&local_4b8,&local_590);
          if ((_Rb_tree_header *)cVar6._M_node != &local_4b8._M_impl.super__Rb_tree_header) {
            Market::display((Market *)(cVar6._M_node + 2));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_590._M_dataplus._M_p != &local_590.field_2) {
            operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
          }
          goto LAB_0013199b;
        }
        bVar1 = false;
      }
      if (local_5b0 != &local_5a0) {
        operator_delete(local_5b0,CONCAT71(uStack_59f,local_5a0) + 1);
      }
    } while (bVar1);
    FIX::Acceptor::stop(false);
    FIX::SocketAcceptor::~SocketAcceptor((SocketAcceptor *)local_200);
    local_2a0[0] = &FIX::Message::typeinfo;
    FIX::Dictionary::~Dictionary(&local_260);
    std::
    _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
    ::~_Rb_tree(&local_290);
    local_358 = __cxa_finalize;
    FIX::Dictionary::~Dictionary(&local_300);
    std::
    _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
    ::~_Rb_tree(&local_330);
    ppuVar4 = local_560;
    ppuVar3 = local_568;
    ppuVar2 = local_570;
    if (local_350 != local_340) {
      operator_delete(local_350,local_340[0] + 1);
    }
    local_508 = local_550;
    local_500 = &PTR__Application_001479a8;
    local_4f8 = local_558;
    local_4f0 = ppuVar4;
    local_4e8 = ppuVar3;
    local_4e0 = ppuVar2;
    local_4d8 = local_548;
    local_4d0 = local_530;
    local_4c8 = local_538;
    local_4c0 = local_540;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>_>_>
    ::~_Rb_tree(&local_4b8);
    FIX::Dictionary::~Dictionary(&local_478.m_defaults);
    std::
    _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
    ::~_Rb_tree((_Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
                 *)&local_478);
    if (local_528[0] != local_518) {
      operator_delete(local_528[0],local_518[0] + 1);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"usage: ",7);
    __s = *argv;
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x14c1b0);
    }
    else {
      sVar7 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," FILE.",6);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
  }
  return 0;
}

Assistant:

int main(int argc, char **argv) {
  if (argc != 2) {
    std::cout << "usage: " << argv[0] << " FILE." << std::endl;
    return 0;
  }
  std::string file = argv[1];

  try {
    FIX::SessionSettings settings(file);

    Application application;
    FIX::FileStoreFactory storeFactory(settings);
    FIX::ScreenLogFactory logFactory(settings);
    FIX::SocketAcceptor acceptor(application, storeFactory, settings, logFactory);

    acceptor.start();
    while (true) {
      std::string value;
      std::cin >> value;

      if (value == "#symbols") {
        application.orderMatcher().display();
      } else if (value == "#quit") {
        break;
      } else {
        application.orderMatcher().display(value);
      }

      std::cout << std::endl;
    }
    acceptor.stop();
    return 0;
  } catch (std::exception &e) {
    std::cout << e.what() << std::endl;
    return 1;
  }
}